

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O3

err_t bakeSWU(octet *pt,bign_params *params,octet *msg)

{
  bool_t bVar1;
  err_t eVar2;
  size_t size;
  ec_o *ec;
  
  bVar1 = memIsValid(params,0x150);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else {
      bVar1 = memIsValid(msg,params->l >> 2);
      if (bVar1 != 0) {
        bVar1 = memIsValid(pt,params->l >> 1);
        if (bVar1 != 0) {
          size = bignStart_keep(params->l,bakeSWU2_deep);
          ec = (ec_o *)blobCreate(size);
          if (ec == (ec_o *)0x0) {
            eVar2 = 0x6e;
          }
          else {
            eVar2 = bignStart(ec,params);
            if (eVar2 == 0) {
              bakeSWU2((word *)pt,ec,msg,(void *)((long)&(ec->hdr).keep + (ec->hdr).keep));
              u64To(pt,params->l >> 1,(u64 *)pt);
              eVar2 = 0;
            }
            blobClose(ec);
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bakeSWU(octet pt[], const bign_params* params, const octet msg[])
{
	err_t code;
	void* state;
	word* W;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	if (!memIsValid(msg, params->l / 4) ||
		!memIsValid(pt, params->l / 2))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bakeSWU2_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	// основные действия
	W = (word*)pt;
	bakeSWU2(W, (const ec_o*)state, msg, objEnd(state, void));
	wwTo(pt, params->l / 2, W);
	// завершение
	blobClose(state);
	return ERR_OK;
}